

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.cc
# Opt level: O3

void __thiscall
gimage::ImageIO::load(ImageIO *this,ImageU16 *image,char *name,int ds,long x,long y,long w,long h)

{
  unsigned_short ***pppuVar1;
  ImageU16 *pIVar2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  iterator iVar6;
  BasicImageIO *pBVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  float *pfVar13;
  long lVar14;
  long lVar15;
  float *pfVar16;
  long lVar17;
  float *pfVar18;
  long lVar19;
  long lVar20;
  long lVar21;
  long lVar22;
  long lVar23;
  long lVar24;
  long lVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  int depth;
  char *local_258;
  long local_250;
  long local_248;
  ImageU16 *local_240;
  long local_238;
  long local_230;
  void *local_228;
  long local_220;
  float *local_218;
  long local_210;
  long local_208;
  ulong local_200;
  long local_1f8;
  long local_1f0;
  long local_1e8;
  long theight;
  long twidth;
  ImageIO *local_1d0;
  BasicImageIO *local_1c8;
  long local_1c0;
  long local_1b8;
  long tborder;
  int local_1a4;
  string tname;
  int local_178;
  Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_> timage;
  long height;
  long width;
  string s_1;
  string suffix;
  string prefix;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  list;
  string s;
  
  local_238 = x;
  local_1d0 = this;
  std::__cxx11::string::string((string *)&s,name,(allocator *)&timage);
  uVar5 = std::__cxx11::string::rfind((char)&s,0x3a);
  if ((uVar5 == 0xffffffffffffffff) ||
     (iVar3 = std::__cxx11::string::compare((ulong)&s,uVar5,(char *)0x2), iVar3 == 0)) {
    pBVar7 = getBasicImageIO(local_1d0,name,true);
    (*pBVar7->_vptr_BasicImageIO[7])(pBVar7,image,name,(ulong)(uint)ds,local_238,y,w,h);
  }
  else {
    local_1c8 = getBasicImageIO(local_1d0,name,true);
    std::__cxx11::string::string((string *)&s_1,name,(allocator *)&timage);
    local_258 = name;
    uVar5 = std::__cxx11::string::rfind((char)&s_1,0x3a);
    if (uVar5 != 0xffffffffffffffff) {
      std::__cxx11::string::compare((ulong)&s_1,uVar5,(char *)0x2);
    }
    std::__cxx11::string::substr((ulong)&prefix,(ulong)&s_1);
    std::__cxx11::string::substr((ulong)&suffix,(ulong)&s_1);
    list._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &list._M_t._M_impl.super__Rb_tree_header._M_header;
    list._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    list._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    list._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    list._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         list._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    anon_unknown_17::loadTiledHeader
              (local_1c8,&list,&prefix,&suffix,&twidth,&theight,&tborder,&width,&height,&depth);
    local_250 = w;
    if (w < 1) {
      local_250 = (width + ds + -1) / (long)ds;
    }
    if (h < 1) {
      h = (height + ds + -1) / (long)ds;
    }
    lVar24 = twidth + tborder * -2;
    lVar20 = theight + tborder * -2;
    local_248 = y;
    local_240 = image;
    local_220 = h;
    if (tborder == 0 && ds == 1) {
      local_1e8 = 0;
      if (0 < local_238) {
        local_1e8 = local_238;
      }
      local_1e8 = local_1e8 / lVar24;
      local_1f0 = (local_250 + local_238 + -1) / lVar24;
      Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_>::setSize
                (image,local_250,h,(long)depth);
      lVar12 = 0;
      if (0 < y) {
        lVar12 = y;
      }
      lVar19 = image->n;
      lVar21 = -lVar19;
      if (0 < lVar19) {
        lVar21 = lVar19;
      }
      memset(image->pixel,0,lVar21 * 2);
      iVar3 = (int)(lVar12 / lVar20);
      iVar4 = (int)((h + y + -1) / lVar20);
      if (iVar3 <= iVar4) {
        local_250 = local_250 + local_238;
        local_220 = local_220 + local_248;
        local_218 = (float *)(long)(int)local_1e8;
        local_208 = CONCAT44(local_208._4_4_,(int)local_1f0 + 1);
        local_230 = (long)iVar3;
        local_228 = (void *)(ulong)(iVar4 + 1);
        local_1c0 = lVar24;
        do {
          if ((int)local_1e8 <= (int)local_1f0) {
            local_210 = local_248 - local_230 * lVar20;
            if (local_210 < 1) {
              local_210 = 0;
            }
            lVar12 = local_230 * lVar20 + local_210;
            local_1b8 = local_220 - lVar12;
            lVar12 = lVar12 - local_248;
            pfVar13 = local_218;
            do {
              lVar19 = local_238 - (long)pfVar13 * lVar24;
              if (lVar19 < 1) {
                lVar19 = 0;
              }
              lVar21 = (long)pfVar13 * lVar24 + lVar19;
              lVar24 = local_250 - lVar21;
              if (twidth - lVar19 <= lVar24) {
                lVar24 = twidth - lVar19;
              }
              lVar8 = theight - local_210;
              if (local_1b8 < theight - local_210) {
                lVar8 = local_1b8;
              }
              anon_unknown_17::getTileName(&tname,&prefix,(int)local_230,(int)pfVar13,&suffix);
              timage.depth = 0;
              timage.row = (unsigned_short **)0x0;
              timage.img = (unsigned_short ***)0x0;
              timage.n = 0;
              timage.pixel = (unsigned_short *)0x0;
              timage.width = 0;
              timage.height = 0;
              Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_>::setSize
                        (&timage,lVar24,lVar8,(long)depth);
              iVar6 = std::
                      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::find(&list._M_t,&tname);
              if (((_Rb_tree_header *)iVar6._M_node != &list._M_t._M_impl.super__Rb_tree_header) &&
                 ((*local_1c8->_vptr_BasicImageIO[7])
                            (local_1c8,&timage,tname._M_dataplus._M_p,1,lVar19,local_210,lVar24,
                             lVar8), 0 < timage.height)) {
                lVar24 = 0;
                do {
                  if (0 < timage.width) {
                    pppuVar1 = local_240->img;
                    lVar19 = 0;
                    do {
                      if (0 < depth) {
                        uVar5 = 0;
                        do {
                          pppuVar1[uVar5][lVar12 + lVar24][(lVar21 - local_238) + lVar19] =
                               timage.img[uVar5][lVar24][lVar19];
                          uVar5 = uVar5 + 1;
                        } while ((uint)depth != uVar5);
                      }
                      lVar19 = lVar19 + 1;
                    } while (lVar19 != timage.width);
                  }
                  lVar24 = lVar24 + 1;
                } while (lVar24 != timage.height);
              }
              Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_>::~Image(&timage);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)tname._M_dataplus._M_p != &tname.field_2) {
                operator_delete(tname._M_dataplus._M_p);
              }
              pfVar13 = (float *)((long)pfVar13 + 1);
              lVar24 = local_1c0;
            } while ((int)local_208 != (int)pfVar13);
          }
          local_230 = local_230 + 1;
        } while ((int)local_228 != (int)local_230);
      }
    }
    else {
      local_210 = (long)ds;
      lVar19 = local_210 * local_238;
      lVar12 = lVar19 - tborder;
      if (lVar19 - tborder < 1) {
        lVar12 = 0;
      }
      lVar8 = local_210 * y;
      lVar21 = lVar8 - tborder;
      if (lVar8 - tborder < 1) {
        lVar21 = 0;
      }
      lVar9 = (local_238 + local_250 + -1) * local_210 + tborder;
      local_200 = ((h + y + -1) * local_210 + tborder) / lVar20;
      lVar22 = (long)depth;
      lVar14 = local_250 * h;
      uVar5 = lVar14 * 4;
      local_218 = (float *)operator_new(lVar22 * uVar5);
      local_1c0 = lVar24;
      memset(local_218,0,lVar22 * uVar5);
      local_228 = operator_new(uVar5);
      memset(local_228,0,uVar5);
      lVar22 = local_250;
      iVar3 = (int)(lVar21 / lVar20);
      if (iVar3 <= (int)local_200) {
        lVar15 = (local_250 + local_238) * local_210;
        lVar21 = (local_220 + local_248) * local_210;
        local_178 = (int)(lVar12 / lVar24);
        iVar4 = (int)(lVar9 / lVar24);
        local_1a4 = iVar4 + 1;
        local_1f8 = (long)iVar3;
        local_200 = (ulong)((int)local_200 + 1);
        do {
          if (local_178 <= iVar4) {
            lVar12 = local_1f8 * lVar20;
            lVar24 = (long)local_178;
            do {
              lVar25 = lVar24 * local_1c0;
              lVar9 = tborder - lVar25;
              local_230 = lVar9 + lVar19;
              if (local_230 < 1) {
                local_230 = 0;
              }
              lVar23 = tborder - lVar12;
              local_208 = lVar23 + lVar8;
              if (local_208 < 1) {
                local_208 = 0;
              }
              lVar9 = (lVar9 + lVar15) - local_230;
              if (twidth - local_230 <= lVar9) {
                lVar9 = twidth - local_230;
              }
              lVar23 = (lVar23 + lVar21) - local_208;
              if (theight - local_208 <= lVar23) {
                lVar23 = theight - local_208;
              }
              anon_unknown_17::getTileName(&tname,&prefix,(int)local_1f8,(int)lVar24,&suffix);
              timage.depth = 0;
              timage.row = (unsigned_short **)0x0;
              timage.img = (unsigned_short ***)0x0;
              timage.n = 0;
              timage.pixel = (unsigned_short *)0x0;
              timage.width = 0;
              timage.height = 0;
              Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_>::setSize
                        (&timage,lVar9,lVar23,(long)depth);
              iVar6 = std::
                      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::find(&list._M_t,&tname);
              if ((_Rb_tree_header *)iVar6._M_node != &list._M_t._M_impl.super__Rb_tree_header) {
                (*local_1c8->_vptr_BasicImageIO[7])
                          (local_1c8,&timage,tname._M_dataplus._M_p,1,local_230,local_208,lVar9,
                           lVar23);
                local_1b8 = timage.height;
                if (0 < timage.height) {
                  fVar26 = (float)tborder + (float)tborder;
                  local_1e8 = theight;
                  local_1f0 = (local_208 + lVar12) - (lVar8 + tborder);
                  lVar9 = 0;
                  do {
                    if (0 < timage.width) {
                      lVar23 = (local_1f0 + lVar9) / local_210;
                      lVar17 = lVar22 * 4 * lVar23;
                      lVar23 = lVar23 * local_250;
                      fVar28 = (float)(local_208 + lVar9) / fVar26;
                      fVar27 = (float)(theight - (local_208 + lVar9)) / fVar26;
                      if (fVar28 <= fVar27) {
                        fVar27 = fVar28;
                      }
                      if (1.0 <= fVar27) {
                        fVar27 = 1.0;
                      }
                      if (fVar27 <= 1e-06) {
                        fVar27 = 1e-06;
                      }
                      lVar11 = 0;
                      do {
                        lVar10 = (((lVar25 + local_230) - (lVar19 + tborder)) + lVar11) / local_210;
                        if (tborder < 1) {
                          if (0 < depth) {
                            pfVar13 = (float *)((long)local_218 + lVar10 * 4 + lVar17);
                            uVar5 = 0;
                            do {
                              *pfVar13 = (float)timage.img[uVar5][lVar9][lVar11] + *pfVar13;
                              uVar5 = uVar5 + 1;
                              pfVar13 = pfVar13 + lVar14;
                            } while ((uint)depth != uVar5);
                          }
                          fVar28 = *(float *)((long)local_228 + lVar10 * 4 + lVar23 * 4) + 1.0;
                        }
                        else {
                          fVar29 = (float)(local_230 + lVar11) / fVar26;
                          fVar28 = (float)(twidth - (local_230 + lVar11)) / fVar26;
                          if (fVar29 <= fVar28) {
                            fVar28 = fVar29;
                          }
                          if (1.0 <= fVar28) {
                            fVar28 = 1.0;
                          }
                          if (fVar28 <= 1e-06) {
                            fVar28 = 1e-06;
                          }
                          if (0 < depth) {
                            pfVar13 = (float *)((long)local_218 + lVar10 * 4 + lVar17);
                            uVar5 = 0;
                            do {
                              *pfVar13 = (float)timage.img[uVar5][lVar9][lVar11] * fVar28 * fVar27 +
                                         *pfVar13;
                              uVar5 = uVar5 + 1;
                              pfVar13 = pfVar13 + lVar14;
                            } while ((uint)depth != uVar5);
                          }
                          fVar28 = fVar28 * fVar27 +
                                   *(float *)((long)local_228 + lVar10 * 4 + lVar23 * 4);
                        }
                        *(float *)((long)local_228 + lVar10 * 4 + lVar23 * 4) = fVar28;
                        lVar11 = lVar11 + 1;
                      } while (lVar11 != timage.width);
                    }
                    lVar9 = lVar9 + 1;
                  } while (lVar9 != timage.height);
                }
              }
              Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_>::~Image(&timage);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)tname._M_dataplus._M_p != &tname.field_2) {
                operator_delete(tname._M_dataplus._M_p);
              }
              lVar24 = lVar24 + 1;
            } while (local_1a4 != (int)lVar24);
          }
          local_1f8 = local_1f8 + 1;
        } while ((int)local_200 != (int)local_1f8);
      }
      lVar20 = local_220;
      pIVar2 = local_240;
      Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_>::setSize
                (local_240,local_250,local_220,(long)depth);
      lVar24 = pIVar2->n;
      lVar12 = -lVar24;
      if (0 < lVar24) {
        lVar12 = lVar24;
      }
      memset(pIVar2->pixel,0,lVar12 * 2);
      if (0 < lVar20) {
        lVar24 = 0;
        pfVar13 = local_218;
        do {
          if (0 < local_250) {
            pppuVar1 = pIVar2->img;
            lVar20 = 0;
            pfVar16 = pfVar13;
            do {
              fVar26 = *(float *)((long)local_228 + lVar20 * 4 + lVar24 * local_250 * 4);
              if ((0.0 < fVar26) && (0 < depth)) {
                uVar5 = 0;
                pfVar18 = pfVar16;
                do {
                  pppuVar1[uVar5][lVar24][lVar20] = (unsigned_short)(int)(*pfVar18 / fVar26);
                  uVar5 = uVar5 + 1;
                  pfVar18 = pfVar18 + lVar14;
                } while ((uint)depth != uVar5);
              }
              lVar20 = lVar20 + 1;
              pfVar16 = pfVar16 + 1;
            } while (lVar20 != local_250);
          }
          lVar24 = lVar24 + 1;
          pfVar13 = pfVar13 + local_250;
        } while (lVar24 != local_220);
      }
      operator_delete(local_228);
      operator_delete(local_218);
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree(&list._M_t);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)suffix._M_dataplus._M_p != &suffix.field_2) {
      operator_delete(suffix._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)prefix._M_dataplus._M_p != &prefix.field_2) {
      operator_delete(prefix._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)s_1._M_dataplus._M_p != &s_1.field_2) {
      operator_delete(s_1._M_dataplus._M_p);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)s._M_dataplus._M_p != &s.field_2) {
    operator_delete(s._M_dataplus._M_p);
  }
  return;
}

Assistant:

void ImageIO::load(ImageU16 &image, const char *name, int ds, long x, long y,
                   long w, long h) const
{
  std::string s=name;
  size_t pos=s.rfind(':');

  if (pos != s.npos && s.compare(pos, 2, ":\\") == 0)
  {
    pos=s.npos;
  }

  if (pos == s.npos)
  {
    getBasicImageIO(name, true).load(image, name, ds, x, y, w, h);
  }
  else
  {
    try
    {
      loadTiled(getBasicImageIO(name, true), image, name, ds, x, y, w, h);
    }
    catch (const std::exception &)
    {
      // if loading as tiled image fails, try loading as image with colon in file name
      getBasicImageIO(name, true).load(image, name, ds, x, y, w, h);
    }
  }
}